

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O3

Hop_Obj_t * Hop_ObjCreatePo(Hop_Man_t *p,Hop_Obj_t *pDriver)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Hop_Obj_t *pHVar3;
  void **ppvVar4;
  ulong uVar5;
  uint uVar6;
  
  pHVar3 = Hop_ManFetchMemory(p);
  *(uint *)&pHVar3->field_0x20 = *(uint *)&pHVar3->field_0x20 & 0xfffffff8 | 3;
  pVVar2 = p->vPos;
  uVar6 = pVVar2->nSize;
  if (uVar6 == pVVar2->nCap) {
    if ((int)uVar6 < 0x10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,0x80);
      }
      pVVar2->pArray = ppvVar4;
      pVVar2->nCap = 0x10;
    }
    else {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar6 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar2->pArray,(ulong)uVar6 << 4);
      }
      pVVar2->pArray = ppvVar4;
      pVVar2->nCap = uVar6 * 2;
    }
  }
  else {
    ppvVar4 = pVVar2->pArray;
  }
  iVar1 = pVVar2->nSize;
  pVVar2->nSize = iVar1 + 1;
  ppvVar4[iVar1] = pHVar3;
  pHVar3->pFanin0 = pDriver;
  uVar5 = (ulong)pDriver & 0xfffffffffffffffe;
  uVar6 = *(uint *)(uVar5 + 0x20) & 0xffffffc0;
  if (p->fRefCount == 0) {
    *(uint *)&pHVar3->field_0x20 = *(uint *)&pHVar3->field_0x20 & 0x3f | uVar6;
  }
  else {
    *(uint *)(uVar5 + 0x20) = uVar6 + (*(uint *)(uVar5 + 0x20) & 0x3f) + 0x40;
  }
  if (((ulong)pDriver & 1) == 0) {
    uVar6 = *(uint *)&pDriver->field_0x20;
  }
  else {
    uVar6 = ~*(uint *)(uVar5 + 0x20);
  }
  *(uint *)&pHVar3->field_0x20 = *(uint *)&pHVar3->field_0x20 & 0xfffffff7 | uVar6 & 8;
  p->nObjs[3] = p->nObjs[3] + 1;
  return pHVar3;
}

Assistant:

Hop_Obj_t * Hop_ObjCreatePo( Hop_Man_t * p, Hop_Obj_t * pDriver )
{
    Hop_Obj_t * pObj;
    pObj = Hop_ManFetchMemory( p );
    pObj->Type = AIG_PO;
    Vec_PtrPush( p->vPos, pObj );
    // add connections
    pObj->pFanin0 = pDriver;
    if ( p->fRefCount )
        Hop_ObjRef( Hop_Regular(pDriver) );
    else
        pObj->nRefs = Hop_ObjLevel( Hop_Regular(pDriver) );
    // set the phase
    pObj->fPhase = Hop_ObjPhaseCompl(pDriver);
    // update node counters of the manager
    p->nObjs[AIG_PO]++;
    return pObj;
}